

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void parse_global_opts(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  _Bool print_template;
  int opt;
  char **argv_local;
  int argc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  while (iVar3 = getopt(argc,argv,"+kpahelo:t:s"), iVar3 != -1) {
    switch(iVar3) {
    case 0x61:
      activate_aspa_update_cb = true;
      print_all_aspa_updates = true;
      break;
    default:
      print_usage(argv);
      exit(1);
    case 0x65:
      export_pfx = true;
      break;
    case 0x6b:
      activate_spki_update_cb = true;
      print_all_spki_updates = true;
      break;
    case 0x6c:
      bVar2 = true;
      break;
    case 0x6f:
      if (export_file_path != (char *)0x0) {
        print_error_exit("output file can not be specified more than once");
      }
      export_file_path = _optarg;
      break;
    case 0x70:
      activate_pfx_update_cb = true;
      print_all_pfx_updates = true;
      break;
    case 0x73:
      print_status_updates = true;
      break;
    case 0x74:
      template_name = _optarg;
    }
  }
  if (bVar2) {
    print_templates();
    exit(0);
  }
  if (((export_file_path != (char *)0x0) || (template_name != (char *)0x0)) &&
     ((export_pfx & 1U) == 0)) {
    print_error_exit("Specifying -o or -t without -e does not make sense");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_global_opts(int argc, char **argv)
{
	int opt;

	bool print_template = false;

	while ((opt = getopt(argc, argv, "+kpahelo:t:s")) != -1) {
		switch (opt) {
		case 'k':
			activate_spki_update_cb = true;
			print_all_spki_updates = true;
			break;

		case 'p':
			activate_pfx_update_cb = true;
			print_all_pfx_updates = true;
			break;

		case 'a':
			activate_aspa_update_cb = true;
			print_all_aspa_updates = true;
			break;

		case 'e':
			export_pfx = true;
			break;

		case 'o':
			if (export_file_path)
				print_error_exit("output file can not be specified more than once");

			export_file_path = optarg;
			break;

		case 't':
			template_name = optarg;
			break;

		case 'l':
			print_template = true;
			break;

		case 's':
			print_status_updates = true;
			break;

		default:
			print_usage(argv);
			exit(EXIT_FAILURE);
		}
	}

	if (print_template) {
		print_templates();
		exit(EXIT_SUCCESS);
	}

	if ((export_file_path || template_name) && !export_pfx)
		print_error_exit("Specifying -o or -t without -e does not make sense");
}